

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O1

void __thiscall sf::Text::ensureGeometryUpdate(Text *this)

{
  VertexArray *this_00;
  VertexArray *this_01;
  String *this_02;
  Color *color;
  Color *color_00;
  float fVar1;
  float fVar2;
  uint uVar3;
  undefined1 auVar4 [12];
  byte bVar5;
  bool bVar6;
  Uint32 second;
  Texture *pTVar7;
  Glyph *pGVar8;
  size_t sVar9;
  size_t sVar10;
  Uint32 UVar11;
  float offset;
  float thickness;
  float offset_00;
  float fVar12;
  float fVar13;
  Vector2f position;
  Vector2f position_00;
  float fVar14;
  undefined1 auVar16 [16];
  float fVar17;
  undefined4 uVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar22;
  undefined1 auVar24 [12];
  undefined1 auVar23 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 local_e8 [16];
  undefined1 local_c8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 auVar15 [16];
  
  if ((this->m_font != (Font *)0x0) &&
     ((this->m_geometryNeedUpdate != false ||
      (pTVar7 = Font::getTexture(this->m_font,this->m_characterSize),
      pTVar7->m_cacheId != this->m_fontTextureId)))) {
    pTVar7 = Font::getTexture(this->m_font,this->m_characterSize);
    this->m_fontTextureId = pTVar7->m_cacheId;
    this->m_geometryNeedUpdate = false;
    this_00 = &this->m_vertices;
    VertexArray::clear(this_00);
    this_01 = &this->m_outlineVertices;
    VertexArray::clear(this_01);
    (this->m_bounds).left = 0.0;
    (this->m_bounds).top = 0.0;
    (this->m_bounds).width = 0.0;
    (this->m_bounds).height = 0.0;
    this_02 = &this->m_string;
    bVar6 = String::isEmpty(this_02);
    if (!bVar6) {
      uVar3 = this->m_style;
      bVar5 = (byte)uVar3;
      bVar6 = (bool)(bVar5 & 1);
      local_e8 = ZEXT816(0);
      fVar14 = 0.0;
      if ((uVar3 & 2) != 0) {
        fVar14 = 0.209;
      }
      offset = Font::getUnderlinePosition(this->m_font,this->m_characterSize);
      thickness = Font::getUnderlineThickness(this->m_font,this->m_characterSize);
      pGVar8 = Font::getGlyph(this->m_font,0x78,this->m_characterSize,bVar6,0.0);
      offset_00 = (pGVar8->bounds).height * 0.5 + (pGVar8->bounds).top;
      pGVar8 = Font::getGlyph(this->m_font,0x20,this->m_characterSize,bVar6,0.0);
      fVar17 = pGVar8->advance;
      fVar22 = this->m_letterSpacingFactor;
      fVar12 = Font::getLineSpacing(this->m_font,this->m_characterSize);
      fVar1 = this->m_lineSpacingFactor;
      local_88._4_4_ = (undefined4)this->m_characterSize;
      local_c8 = ZEXT416((uint)local_88._4_4_);
      sVar9 = String::getSize(this_02);
      local_88._0_4_ = local_88._4_4_;
      fStack_80 = (float)local_88._4_4_;
      fStack_7c = (float)local_88._4_4_;
      if (sVar9 == 0) {
        local_98._0_8_ = 0;
      }
      else {
        fVar22 = (fVar22 + -1.0) * (fVar17 / 3.0);
        fVar17 = fVar17 + fVar22;
        color = &this->m_fillColor;
        color_00 = &this->m_outlineColor;
        UVar11 = 0;
        sVar9 = 0;
        local_e8 = ZEXT816(0);
        local_98 = ZEXT816(0);
        do {
          second = String::operator[](this_02,sVar9);
          if (second != 0xd) {
            fVar13 = Font::getKerning(this->m_font,UVar11,second,this->m_characterSize,bVar6);
            local_e8._0_4_ = (float)local_e8._0_4_ + fVar13;
            if ((UVar11 != 10 & bVar5 >> 2 & second == 10) == 1) {
              anon_unknown.dwarf_286b13::addLine
                        (this_00,(float)local_e8._0_4_,(float)local_c8._0_4_,color,offset,thickness,
                         0.0);
              fVar13 = this->m_outlineThickness;
              if ((fVar13 != 0.0) || (NAN(fVar13))) {
                anon_unknown.dwarf_286b13::addLine
                          (this_01,(float)local_e8._0_4_,(float)local_c8._0_4_,color_00,offset,
                           thickness,fVar13);
              }
            }
            if ((bVar5 >> 3 & UVar11 != 10 & second == 10) == 1) {
              anon_unknown.dwarf_286b13::addLine
                        (this_00,(float)local_e8._0_4_,(float)local_c8._0_4_,color,offset_00,
                         thickness,0.0);
              fVar13 = this->m_outlineThickness;
              if ((fVar13 != 0.0) || (NAN(fVar13))) {
                anon_unknown.dwarf_286b13::addLine
                          (this_01,(float)local_e8._0_4_,(float)local_c8._0_4_,color_00,offset_00,
                           thickness,fVar13);
              }
            }
            UVar11 = second;
            if ((second < 0x21) && ((0x100000600U >> ((ulong)second & 0x3f) & 1) != 0)) {
              auVar16._4_4_ = local_e8._4_4_;
              auVar16._0_4_ = local_e8._0_4_;
              uVar21 = local_c8._4_4_;
              auVar16._8_4_ = local_e8._4_4_;
              auVar16._12_4_ = uVar21;
              auVar15._8_8_ = auVar16._8_8_;
              auVar15._4_4_ = local_c8._0_4_;
              auVar15._0_4_ = local_e8._0_4_;
              if (second == 9) {
                auVar24._4_8_ = local_c8._8_8_;
                auVar24._0_4_ = local_c8._0_4_;
                auVar20._0_8_ = auVar24._0_8_ << 0x20;
                auVar20._8_4_ = local_e8._4_4_;
                auVar20._12_4_ = uVar21;
                auVar19._4_12_ = auVar20._4_12_;
                auVar19._0_4_ = fVar17 * 4.0 + (float)local_e8._0_4_;
              }
              else if (second == 10) {
                auVar19 = ZEXT416((uint)((float)local_c8._0_4_ + fVar12 * fVar1)) << 0x20;
              }
              else {
                auVar19._4_4_ = local_c8._0_4_;
                auVar19._0_4_ = local_e8._0_4_;
                auVar19._8_4_ = local_e8._4_4_;
                auVar19._12_4_ = uVar21;
                if (second == 0x20) {
                  auVar4._4_8_ = auVar19._8_8_;
                  auVar4._0_4_ = local_c8._0_4_;
                  auVar18._0_8_ = auVar4._0_8_ << 0x20;
                  auVar18._8_4_ = local_e8._4_4_;
                  auVar18._12_4_ = uVar21;
                  auVar19._4_12_ = auVar18._4_12_;
                  auVar19._0_4_ = (float)local_e8._0_4_ + fVar17;
                }
              }
              _local_88 = minps(auVar15,_local_88);
              local_c8._4_4_ = auVar19._4_4_;
              local_98 = maxps(auVar19,local_98);
              local_c8._0_4_ = local_c8._4_4_;
              local_c8._8_4_ = local_c8._4_4_;
              local_c8._12_4_ = local_c8._4_4_;
              local_e8 = auVar19;
            }
            else {
              fVar13 = this->m_outlineThickness;
              if ((fVar13 != 0.0) || (NAN(fVar13))) {
                pGVar8 = Font::getGlyph(this->m_font,second,this->m_characterSize,bVar6,fVar13);
                position.y = (float)local_c8._0_4_;
                position.x = (float)local_e8._0_4_;
                anon_unknown.dwarf_286b13::addGlyphQuad(this_01,position,color_00,pGVar8,fVar14);
              }
              pGVar8 = Font::getGlyph(this->m_font,second,this->m_characterSize,bVar6,0.0);
              position_00.y = (float)local_c8._0_4_;
              position_00.x = (float)local_e8._0_4_;
              anon_unknown.dwarf_286b13::addGlyphQuad(this_00,position_00,color,pGVar8,fVar14);
              fVar13 = (pGVar8->bounds).left;
              fVar2 = (pGVar8->bounds).top;
              auVar24 = local_e8._4_12_;
              fVar25 = (pGVar8->bounds).height + fVar2;
              auVar26._0_4_ = -fVar14 * fVar25 + (float)local_e8._0_4_ + fVar13;
              auVar23._0_4_ =
                   -fVar14 * fVar2 + fVar13 + (pGVar8->bounds).width + (float)local_e8._0_4_;
              auVar26._4_4_ = fVar2 + (float)local_c8._0_4_;
              auVar26._8_4_ = 0x80000000;
              auVar26._12_4_ = 0;
              _local_88 = minps(auVar26,_local_88);
              auVar23._4_4_ = fVar25 + (float)local_c8._0_4_;
              auVar23._8_4_ = 0x80000000;
              auVar23._12_4_ = 0;
              local_98 = maxps(auVar23,local_98);
              local_e8._0_4_ = (float)local_e8._0_4_ + pGVar8->advance + fVar22;
              local_e8._4_12_ = auVar24;
            }
          }
          sVar9 = sVar9 + 1;
          sVar10 = String::getSize(this_02);
        } while (sVar9 < sVar10);
      }
      fVar14 = this->m_outlineThickness;
      if ((fVar14 != 0.0) || (NAN(fVar14))) {
        fVar14 = ceilf(fVar14);
        local_88._4_4_ = (float)local_88._4_4_ - ABS(fVar14);
        local_88._0_4_ = (float)local_88._0_4_ - ABS(fVar14);
        local_98._4_4_ = (float)local_98._4_4_ + ABS(fVar14);
        local_98._0_4_ = (float)local_98._0_4_ + ABS(fVar14);
      }
      if (((uVar3 & 4) != 0) && (0.0 < (float)local_e8._0_4_)) {
        anon_unknown.dwarf_286b13::addLine
                  (this_00,(float)local_e8._0_4_,(float)local_c8._0_4_,&this->m_fillColor,offset,
                   thickness,0.0);
        fVar14 = this->m_outlineThickness;
        if ((fVar14 != 0.0) || (NAN(fVar14))) {
          anon_unknown.dwarf_286b13::addLine
                    (this_01,(float)local_e8._0_4_,(float)local_c8._0_4_,&this->m_outlineColor,
                     offset,thickness,fVar14);
        }
      }
      if (((uVar3 & 8) != 0) && (0.0 < (float)local_e8._0_4_)) {
        anon_unknown.dwarf_286b13::addLine
                  (this_00,(float)local_e8._0_4_,(float)local_c8._0_4_,&this->m_fillColor,offset_00,
                   thickness,0.0);
        fVar14 = this->m_outlineThickness;
        if ((fVar14 != 0.0) || (NAN(fVar14))) {
          anon_unknown.dwarf_286b13::addLine
                    (this_01,(float)local_e8._0_4_,(float)local_c8._0_4_,&this->m_outlineColor,
                     offset_00,thickness,fVar14);
        }
      }
      (this->m_bounds).left = (float)local_88._0_4_;
      (this->m_bounds).top = (float)local_88._4_4_;
      (this->m_bounds).width = (float)local_98._0_4_ - (float)local_88._0_4_;
      (this->m_bounds).height = (float)local_98._4_4_ - (float)local_88._4_4_;
    }
  }
  return;
}

Assistant:

void Text::ensureGeometryUpdate() const
{
    if (!m_font)
        return;

    // Do nothing, if geometry has not changed and the font texture has not changed
    if (!m_geometryNeedUpdate && m_font->getTexture(m_characterSize).m_cacheId == m_fontTextureId)
        return;

    // Save the current fonts texture id
    m_fontTextureId = m_font->getTexture(m_characterSize).m_cacheId;

    // Mark geometry as updated
    m_geometryNeedUpdate = false;

    // Clear the previous geometry
    m_vertices.clear();
    m_outlineVertices.clear();
    m_bounds = FloatRect();

    // No text: nothing to draw
    if (m_string.isEmpty())
        return;

    // Compute values related to the text style
    bool  isBold             = m_style & Bold;
    bool  isUnderlined       = m_style & Underlined;
    bool  isStrikeThrough    = m_style & StrikeThrough;
    float italicShear        = (m_style & Italic) ? 0.209f : 0.f; // 12 degrees in radians
    float underlineOffset    = m_font->getUnderlinePosition(m_characterSize);
    float underlineThickness = m_font->getUnderlineThickness(m_characterSize);

    // Compute the location of the strike through dynamically
    // We use the center point of the lowercase 'x' glyph as the reference
    // We reuse the underline thickness as the thickness of the strike through as well
    FloatRect xBounds = m_font->getGlyph(L'x', m_characterSize, isBold).bounds;
    float strikeThroughOffset = xBounds.top + xBounds.height / 2.f;

    // Precompute the variables needed by the algorithm
    float whitespaceWidth = m_font->getGlyph(L' ', m_characterSize, isBold).advance;
    float letterSpacing   = ( whitespaceWidth / 3.f ) * ( m_letterSpacingFactor - 1.f );
    whitespaceWidth      += letterSpacing;
    float lineSpacing     = m_font->getLineSpacing(m_characterSize) * m_lineSpacingFactor;
    float x               = 0.f;
    float y               = static_cast<float>(m_characterSize);

    // Create one quad for each character
    float minX = static_cast<float>(m_characterSize);
    float minY = static_cast<float>(m_characterSize);
    float maxX = 0.f;
    float maxY = 0.f;
    Uint32 prevChar = 0;
    for (std::size_t i = 0; i < m_string.getSize(); ++i)
    {
        Uint32 curChar = m_string[i];

        // Skip the \r char to avoid weird graphical issues
        if (curChar == L'\r')
            continue;

        // Apply the kerning offset
        x += m_font->getKerning(prevChar, curChar, m_characterSize, isBold);

        // If we're using the underlined style and there's a new line, draw a line
        if (isUnderlined && (curChar == L'\n' && prevChar != L'\n'))
        {
            addLine(m_vertices, x, y, m_fillColor, underlineOffset, underlineThickness);

            if (m_outlineThickness != 0)
                addLine(m_outlineVertices, x, y, m_outlineColor, underlineOffset, underlineThickness, m_outlineThickness);
        }

        // If we're using the strike through style and there's a new line, draw a line across all characters
        if (isStrikeThrough && (curChar == L'\n' && prevChar != L'\n'))
        {
            addLine(m_vertices, x, y, m_fillColor, strikeThroughOffset, underlineThickness);

            if (m_outlineThickness != 0)
                addLine(m_outlineVertices, x, y, m_outlineColor, strikeThroughOffset, underlineThickness, m_outlineThickness);
        }

        prevChar = curChar;

        // Handle special characters
        if ((curChar == L' ') || (curChar == L'\n') || (curChar == L'\t'))
        {
            // Update the current bounds (min coordinates)
            minX = std::min(minX, x);
            minY = std::min(minY, y);

            switch (curChar)
            {
                case L' ':  x += whitespaceWidth;     break;
                case L'\t': x += whitespaceWidth * 4; break;
                case L'\n': y += lineSpacing; x = 0;  break;
            }

            // Update the current bounds (max coordinates)
            maxX = std::max(maxX, x);
            maxY = std::max(maxY, y);

            // Next glyph, no need to create a quad for whitespace
            continue;
        }

        // Apply the outline
        if (m_outlineThickness != 0)
        {
            const Glyph& glyph = m_font->getGlyph(curChar, m_characterSize, isBold, m_outlineThickness);

            // Add the outline glyph to the vertices
            addGlyphQuad(m_outlineVertices, Vector2f(x, y), m_outlineColor, glyph, italicShear);
        }

        // Extract the current glyph's description
        const Glyph& glyph = m_font->getGlyph(curChar, m_characterSize, isBold);

        // Add the glyph to the vertices
        addGlyphQuad(m_vertices, Vector2f(x, y), m_fillColor, glyph, italicShear);

        // Update the current bounds
        float left   = glyph.bounds.left;
        float top    = glyph.bounds.top;
        float right  = glyph.bounds.left + glyph.bounds.width;
        float bottom = glyph.bounds.top + glyph.bounds.height;

        minX = std::min(minX, x + left - italicShear * bottom);
        maxX = std::max(maxX, x + right - italicShear * top);
        minY = std::min(minY, y + top);
        maxY = std::max(maxY, y + bottom);

        // Advance to the next character
        x += glyph.advance + letterSpacing;
    }

    // If we're using outline, update the current bounds
    if (m_outlineThickness != 0)
    {
        float outline = std::abs(std::ceil(m_outlineThickness));
        minX -= outline;
        maxX += outline;
        minY -= outline;
        maxY += outline;
    }

    // If we're using the underlined style, add the last line
    if (isUnderlined && (x > 0))
    {
        addLine(m_vertices, x, y, m_fillColor, underlineOffset, underlineThickness);

        if (m_outlineThickness != 0)
            addLine(m_outlineVertices, x, y, m_outlineColor, underlineOffset, underlineThickness, m_outlineThickness);
    }

    // If we're using the strike through style, add the last line across all characters
    if (isStrikeThrough && (x > 0))
    {
        addLine(m_vertices, x, y, m_fillColor, strikeThroughOffset, underlineThickness);

        if (m_outlineThickness != 0)
            addLine(m_outlineVertices, x, y, m_outlineColor, strikeThroughOffset, underlineThickness, m_outlineThickness);
    }

    // Update the bounding rectangle
    m_bounds.left = minX;
    m_bounds.top = minY;
    m_bounds.width = maxX - minX;
    m_bounds.height = maxY - minY;
}